

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O0

void __thiscall
QListModel::ensureSorted(QListModel *this,int column,SortOrder order,int start,int end)

{
  const_iterator __last;
  const_iterator __first;
  bool bVar1;
  int in_ECX;
  undefined4 in_EDX;
  int in_ESI;
  long *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  bool needsSorting;
  const_iterator endChangedIterator;
  const_iterator beginChangedIterator;
  anon_class_1_0_00000001 compareGt;
  anon_class_1_0_00000001 compareLt;
  _func_bool_QListWidgetItem_ptr_QListWidgetItem_ptr *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  qsizetype local_48;
  int local_3c;
  QListWidgetItem **local_38;
  QListWidgetItem **local_30;
  int local_28;
  int local_24;
  QListWidgetItem **local_20;
  QListWidgetItem **local_18;
  __1 local_a;
  __0 local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    local_9 = (__0)0xaa;
    local_a = (__1)0xaa;
    local_18 = (QListWidgetItem **)&DAT_aaaaaaaaaaaaaaaa;
    local_20 = (QListWidgetItem **)
               QList<QListWidgetItem_*>::constBegin
                         ((QList<QListWidgetItem_*> *)
                          CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    local_24 = in_ECX + -1;
    local_28 = 0;
    qMax<int>(&local_24,&local_28);
    local_18 = (QListWidgetItem **)
               QList<QListWidgetItem_*>::const_iterator::operator+
                         ((const_iterator *)
                          CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          (qsizetype)in_stack_ffffffffffffff68);
    local_30 = (QListWidgetItem **)&DAT_aaaaaaaaaaaaaaaa;
    local_38 = (QListWidgetItem **)
               QList<QListWidgetItem_*>::constBegin
                         ((QList<QListWidgetItem_*> *)
                          CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    local_3c = in_R8D + 2;
    local_48 = QList<QListWidgetItem_*>::size((QList<QListWidgetItem_*> *)(in_RDI + 2));
    qMin<int,long_long>(&local_3c,&local_48);
    local_30 = (QListWidgetItem **)
               QList<QListWidgetItem_*>::const_iterator::operator+
                         ((const_iterator *)
                          CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          (qsizetype)in_stack_ffffffffffffff68);
    ensureSorted(int,Qt::SortOrder,int,int)::$_0::operator_cast_to_function_pointer(&local_9);
    ensureSorted(int,Qt::SortOrder,int,int)::$_1::operator_cast_to_function_pointer(&local_a);
    __first.i._4_4_ = in_ESI;
    __first.i._0_4_ = in_EDX;
    __last.i._4_4_ = in_ECX;
    __last.i._0_4_ = in_R8D;
    bVar1 = std::
            is_sorted<QList<QListWidgetItem*>::const_iterator,bool(*)(QListWidgetItem_const*,QListWidgetItem_const*)>
                      (__first,__last,in_stack_ffffffffffffff68);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      (**(code **)(*in_RDI + 0x140))(in_RDI,in_ESI,in_EDX);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListModel::ensureSorted(int column, Qt::SortOrder order, int start, int end)
{
    if (column != 0)
        return;

    const auto compareLt = [](const QListWidgetItem *left, const QListWidgetItem *right) -> bool {
        return *left < *right;
    };

    const auto compareGt = [](const QListWidgetItem *left, const QListWidgetItem *right) -> bool {
        return *right < *left;
    };

    /** Check if range [start,end] is already in sorted position in list.
     *  Take for this the assumption, that outside [start,end] the list
     *  is already sorted. Therefore the sorted check has to be extended
     *  to the first element that is known to be sorted before the range
     *  [start, end], which is (start-1) and the first element after the
     *  range [start, end], which is (end+2) due to end being included.
    */
    const auto beginChangedIterator = items.constBegin() + qMax(start - 1, 0);
    const auto endChangedIterator = items.constBegin() + qMin(end + 2, items.size());
    const bool needsSorting = !std::is_sorted(beginChangedIterator, endChangedIterator,
                                              order == Qt::AscendingOrder ? compareLt : compareGt);

    if (needsSorting)
        sort(column, order);
}